

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O0

json_t * pack_object_inter(scanner_t *s,va_list *ap,int need_incref)

{
  char cVar1;
  uint uVar2;
  scanner_t *local_50;
  undefined8 *local_48;
  char ntoken;
  json_t *json;
  int need_incref_local;
  va_list *ap_local;
  scanner_t *s_local;
  
  next_token(s);
  cVar1 = (s->token).token;
  if ((cVar1 != '?') && (cVar1 != '*')) {
    prev_token(s);
  }
  uVar2 = (*ap)[0].gp_offset;
  if (uVar2 < 0x29) {
    local_48 = (undefined8 *)((long)(int)uVar2 + (long)(*ap)[0].reg_save_area);
    (*ap)[0].gp_offset = uVar2 + 8;
  }
  else {
    local_48 = (undefined8 *)(*ap)[0].overflow_arg_area;
    (*ap)[0].overflow_arg_area = local_48 + 1;
  }
  local_50 = (scanner_t *)*local_48;
  if (local_50 == (scanner_t *)0x0) {
    if (cVar1 == '*') {
      s_local = (scanner_t *)0x0;
    }
    else if (cVar1 == '?') {
      s_local = (scanner_t *)json_null();
    }
    else {
      set_error(s,"<args>",json_error_null_value,"NULL object");
      s->has_error = 1;
      s_local = (scanner_t *)0x0;
    }
  }
  else {
    if (need_incref != 0) {
      local_50 = (scanner_t *)json_incref((json_t *)local_50);
    }
    s_local = local_50;
  }
  return (json_t *)s_local;
}

Assistant:

static json_t *pack_object_inter(scanner_t *s, va_list *ap, int need_incref) {
    json_t *json;
    char ntoken;

    next_token(s);
    ntoken = token(s);

    if (ntoken != '?' && ntoken != '*')
        prev_token(s);

    json = va_arg(*ap, json_t *);

    if (json)
        return need_incref ? json_incref(json) : json;

    switch (ntoken) {
        case '?':
            return json_null();
        case '*':
            return NULL;
        default:
            break;
    }

    set_error(s, "<args>", json_error_null_value, "NULL object");
    s->has_error = 1;
    return NULL;
}